

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEES_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::SEES_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,SEES_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pPVar3;
  pointer pVVar4;
  string local_270 [32];
  __normal_iterator<const_KDIS::DATA_TYPE::VectoringNozzleSystem_*,_std::vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>_>
  local_250;
  __normal_iterator<const_KDIS::DATA_TYPE::VectoringNozzleSystem_*,_std::vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>_>
  local_248;
  const_iterator citrVNS;
  __normal_iterator<const_KDIS::DATA_TYPE::PropulsionSystem_*,_std::vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>_>
  local_220;
  __normal_iterator<const_KDIS::DATA_TYPE::PropulsionSystem_*,_std::vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>_>
  local_218;
  const_iterator citrPS;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  SEES_PDU *local_18;
  SEES_PDU *this_local;
  
  local_18 = this;
  this_local = (SEES_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,&this->super_Header);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-SEES PDU-\n");
  poVar2 = std::operator<<(poVar2,"Originating Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_((KString *)&citrPS,&this->m_OriginatingEntity)
  ;
  UTILS::IndentString(&local_1f0,(KString *)&citrPS,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"IR Signature Representation Index:                  ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16IrSigRepIndex);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Acosutic Signature Representation Index:            ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16AcousticSigRepIndex);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Radar Cross Section Signature Representation Index: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16CrossSection);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Propulsion Systems:                       ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumPropulsionSys);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Vectoring Nozzle Systems:                 ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumVectoringNozzleSys);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&citrPS);
  std::__cxx11::string::~string((string *)&local_1c0);
  local_218._M_current =
       (PropulsionSystem *)
       std::
       vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
       ::begin(&this->m_vPropSys);
  while( true ) {
    local_220._M_current =
         (PropulsionSystem *)
         std::
         vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
         ::end(&this->m_vPropSys);
    bVar1 = __gnu_cxx::operator!=(&local_218,&local_220);
    if (!bVar1) break;
    pPVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::PropulsionSystem_*,_std::vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>_>
             ::operator->(&local_218);
    (*(pPVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&citrVNS);
    std::operator<<(local_190,(string *)&citrVNS);
    std::__cxx11::string::~string((string *)&citrVNS);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::PropulsionSystem_*,_std::vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>_>
    ::operator++(&local_218);
  }
  local_248._M_current =
       (VectoringNozzleSystem *)
       std::
       vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
       ::begin(&this->m_vVecNozzleSys);
  while( true ) {
    local_250._M_current =
         (VectoringNozzleSystem *)
         std::
         vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
         ::end(&this->m_vVecNozzleSys);
    bVar1 = __gnu_cxx::operator!=(&local_248,&local_250);
    if (!bVar1) break;
    pVVar4 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::VectoringNozzleSystem_*,_std::vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>_>
             ::operator->(&local_248);
    (*(pVVar4->super_DataTypeBase)._vptr_DataTypeBase[2])(local_270);
    std::operator<<(local_190,local_270);
    std::__cxx11::string::~string(local_270);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::VectoringNozzleSystem_*,_std::vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>_>
    ::operator++(&local_248);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString SEES_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-SEES PDU-\n"
       << "Originating Entity ID:\n"
       << IndentString( m_OriginatingEntity.GetAsString(), 1 )
       << "IR Signature Representation Index:                  " << m_ui16IrSigRepIndex         << "\n"
       << "Acosutic Signature Representation Index:            " << m_ui16AcousticSigRepIndex   << "\n"
       << "Radar Cross Section Signature Representation Index: " << m_ui16CrossSection          << "\n"
       << "Number Of Propulsion Systems:                       " << m_ui16NumPropulsionSys      << "\n"
       << "Number Of Vectoring Nozzle Systems:                 " << m_ui16NumVectoringNozzleSys << "\n";

    vector<PropulsionSystem>::const_iterator citrPS = m_vPropSys.begin();

    for( ; citrPS != m_vPropSys.end(); ++citrPS )
    {
        ss << citrPS->GetAsString();
    }

    vector<VectoringNozzleSystem>::const_iterator citrVNS = m_vVecNozzleSys.begin();

    for( ; citrVNS != m_vVecNozzleSys.end(); ++citrVNS )
    {
        ss << citrVNS->GetAsString();
    }

    return ss.str();
}